

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

string * __thiscall
helics::apps::RegexMatcher::generateMatch_abi_cxx11_
          (string *__return_storage_ptr__,RegexMatcher *this,string_view testString)

{
  size_t sVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  char *pcVar10;
  size_t __n;
  char *__data;
  long lVar11;
  pointer psVar12;
  pointer psVar13;
  ulong uVar14;
  ulong uVar15;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> matchResults;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_58;
  
  local_58.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar3 = std::__detail::
          __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (testString._M_str,testString._M_str + testString._M_len,&local_58,&this->rmatch
                     ,0);
  if (bVar3) {
    pcVar10 = (this->interface2)._M_str;
    sVar1 = (this->interface2)._M_len;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar10,pcVar10 + sVar1);
    iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(__return_storage_ptr__,0,6,"REGEX:");
    if (iVar4 == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (__return_storage_ptr__,0,6);
      pbVar5 = (this->keys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->keys).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
        uVar14 = 0;
        do {
          uVar6 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                            (__return_storage_ptr__,pbVar5[uVar14]._M_dataplus._M_p,0,
                             pbVar5[uVar14]._M_string_length);
          uVar15 = uVar14 + 1;
          while (uVar6 != 0xffffffffffffffff) {
            pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
            uVar7 = 0xffffffffffffffff;
            __n = __return_storage_ptr__->_M_string_length - uVar6;
            if (uVar6 <= __return_storage_ptr__->_M_string_length && __n != 0) {
              pvVar8 = memchr(pcVar2 + uVar6,0x29,__n);
              uVar7 = -(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)pcVar2;
            }
            lVar11 = (long)local_58.
                           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if (lVar11 == 0) {
              pcVar10 = local_58.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-3].
                        super_pair<const_char_*,_const_char_*>.first;
LAB_001bfdb6:
              psVar12 = (pointer)((long)local_58.
                                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x48);
            }
            else {
              uVar9 = (lVar11 >> 3) * -0x5555555555555555 - 3;
              psVar12 = local_58.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar15;
              psVar13 = (pointer)((long)local_58.
                                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x48);
              if (uVar15 < uVar9) {
                psVar13 = psVar12;
              }
              pcVar10 = (psVar13->super_pair<const_char_*,_const_char_*>).first;
              if (uVar9 <= uVar15) goto LAB_001bfdb6;
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            replace(__return_storage_ptr__,(long)(pcVar2 + (uVar6 - 1)) - (long)pcVar2,
                    (size_type)(pcVar2 + ((uVar7 + 1) - (long)(pcVar2 + (uVar6 - 1)))),pcVar10,
                    (long)(psVar12->super_pair<const_char_*,_const_char_*>).second - (long)pcVar10);
            pbVar5 = (this->keys).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar6 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                              (__return_storage_ptr__,pbVar5[uVar14]._M_dataplus._M_p,0,
                               pbVar5[uVar14]._M_string_length);
          }
          pbVar5 = (this->keys).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = uVar15;
        } while (uVar15 < (ulong)((long)(this->keys).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >>
                                 5));
      }
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  if (local_58.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generateMatch(std::string_view testString)
    {
        std::match_results<typename decltype(testString)::const_iterator> matchResults{};
        if (std::regex_match(testString.begin(), testString.end(), matchResults, rmatch)) {
            std::string matcher(interface2);
            if (matcher.compare(0, 6, "REGEX:") == 0) {
                matcher.erase(0, 6);
                for (std::size_t ii = 0; ii < keys.size(); ++ii) {
                    auto keyloc = matcher.find(keys[ii]);
                    while (keyloc != std::string::npos) {
                        auto endloc = matcher.find_first_of(')', keyloc);
                        matcher.replace(matcher.begin() + keyloc - 1,
                                        matcher.begin() + endloc + 1,
                                        matchResults[ii + 1].first,
                                        matchResults[ii + 1].second);
                        keyloc = matcher.find(keys[ii]);
                    }
                }
            }

            return matcher;
        }
        return {};
    }